

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Gia_Man_t * Gia_MiniAigMiter(Mini_Aig_t *p,int *pEquivs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar7;
  int local_48;
  int Temp;
  int nPos;
  int iPos;
  int nNodes;
  int iGiaLit2;
  int iGiaLit;
  int i;
  Vec_Int_t *vCopies;
  Gia_Man_t *pTemp;
  Gia_Man_t *pGia;
  int *pEquivs_local;
  Mini_Aig_t *p_local;
  
  Temp = 0;
  local_48 = 0;
  iVar2 = Mini_AigNodeNum(p);
  p_00 = Gia_ManStart(iVar2 << 1);
  pcVar6 = Abc_UtilStrsav("MiniAig");
  p_00->pName = pcVar6;
  p_01 = Vec_IntAlloc(iVar2);
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  iGiaLit2 = 1;
  do {
    if (iVar2 <= iGiaLit2) {
      iVar3 = Vec_IntSize(p_01);
      if (iVar3 != iVar2) {
        __assert_fail("Vec_IntSize(vCopies) == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                      ,0x2ea,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
      }
      iVar3 = Mini_AigRegNum(p);
      if (local_48 <= iVar3) {
        __assert_fail("nPos > Mini_AigRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                      ,0x2eb,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
      }
      for (iGiaLit2 = 1; iGiaLit2 < iVar2; iGiaLit2 = iGiaLit2 + 1) {
        if (pEquivs[iGiaLit2] != -1) {
          iVar3 = Vec_IntEntry(p_01,iGiaLit2);
          iVar4 = Abc_Lit2Var(pEquivs[iGiaLit2]);
          iVar4 = Vec_IntEntry(p_01,iVar4);
          iVar5 = Abc_LitIsCompl(pEquivs[iGiaLit2]);
          iVar4 = Abc_LitNotCond(iVar4,iVar5);
          iVar3 = Gia_ManHashXor(p_00,iVar3,iVar4);
          Gia_ManAppendCo(p_00,iVar3);
        }
      }
      iVar3 = Gia_ManCoNum(p_00);
      for (iGiaLit2 = 1; iGiaLit2 < iVar2; iGiaLit2 = iGiaLit2 + 1) {
        iVar4 = Mini_AigNodeIsPo(p,iGiaLit2);
        if (iVar4 != 0) {
          iVar4 = Temp + 1;
          iVar5 = Mini_AigRegNum(p);
          bVar1 = local_48 - iVar5 <= Temp;
          Temp = iVar4;
          if (bVar1) {
            iVar4 = Gia_ObjFromMiniFanin0Copy(p_00,p_01,p,iGiaLit2);
            Gia_ManAppendCo(p_00,iVar4);
          }
        }
      }
      if (Temp != local_48) {
        __assert_fail("iPos == nPos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                      ,0x2fe,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
      }
      iVar2 = Mini_AigRegNum(p);
      iVar4 = Gia_ManCoNum(p_00);
      if (iVar2 != iVar4 - iVar3) {
        __assert_fail("Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                      ,0x2ff,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
      }
      iVar2 = Mini_AigRegNum(p);
      Gia_ManSetRegNum(p_00,iVar2);
      Gia_ManHashStop(p_00);
      Vec_IntFree(p_01);
      pGVar7 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar7;
    }
    iVar3 = Mini_AigNodeIsPi(p,iGiaLit2);
    if (iVar3 == 0) {
      iVar3 = Mini_AigNodeIsPo(p,iGiaLit2);
      if (iVar3 == 0) {
        iVar3 = Mini_AigNodeIsAnd(p,iGiaLit2);
        if (iVar3 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                        ,0x2e7,"Gia_Man_t *Gia_MiniAigMiter(Mini_Aig_t *, int *)");
        }
        iVar3 = Gia_ObjFromMiniFanin0Copy(p_00,p_01,p,iGiaLit2);
        iVar4 = Gia_ObjFromMiniFanin1Copy(p_00,p_01,p,iGiaLit2);
        nNodes = Gia_ManHashAnd(p_00,iVar3,iVar4);
        goto LAB_009a7054;
      }
      local_48 = local_48 + 1;
      Vec_IntPush(p_01,-1);
    }
    else {
      nNodes = Gia_ManAppendCi(p_00);
LAB_009a7054:
      Vec_IntPush(p_01,nNodes);
    }
    iGiaLit2 = iGiaLit2 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_MiniAigMiter( Mini_Aig_t * p, int * pEquivs )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, iGiaLit2, nNodes, iPos = 0, nPos = 0, Temp;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( 2 * nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            nPos++;
            Vec_IntPush( vCopies, -1 );
            continue;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, iGiaLit );
    }
    assert( Vec_IntSize(vCopies) == nNodes );
    assert( nPos > Mini_AigRegNum(p) );
    // create miters for each equiv class
    for ( i = 1; i < nNodes; i++ )
    {
        if ( pEquivs[i] == -1 )
            continue;
        iGiaLit = Vec_IntEntry(vCopies, i);
        iGiaLit2 = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(pEquivs[i])), Abc_LitIsCompl(pEquivs[i]) );
        Gia_ManAppendCo( pGia, Gia_ManHashXor(pGia, iGiaLit, iGiaLit2) );
    }
    // create flop inputs
    Temp = Gia_ManCoNum(pGia);
    for ( i = 1; i < nNodes; i++ )
    {
        if ( !Mini_AigNodeIsPo( p, i ) )
            continue;
        if ( iPos++ >= nPos - Mini_AigRegNum(p) )
            Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
    }
    assert( iPos == nPos );
    assert( Mini_AigRegNum(p) == Gia_ManCoNum(pGia) - Temp );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    Gia_ManHashStop( pGia );
    Vec_IntFree( vCopies );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}